

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddImage
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *a,ImVec2 *b,ImVec2 *uv_a,
          ImVec2 *uv_b,ImU32 col)

{
  bool bVar1;
  value_type *ppvVar2;
  bool bVar3;
  bool push_texture_id;
  ImVec2 *uv_b_local;
  ImVec2 *uv_a_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  ImTextureID user_texture_id_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    bVar1 = ImVector<void_*>::empty(&this->_TextureIdStack);
    bVar3 = true;
    if (!bVar1) {
      ppvVar2 = ImVector<void_*>::back(&this->_TextureIdStack);
      bVar3 = user_texture_id != *ppvVar2;
    }
    if (bVar3) {
      PushTextureID(this,user_texture_id);
    }
    PrimReserve(this,6,4);
    PrimRectUV(this,a,b,uv_a,uv_b,col);
    if (bVar3) {
      PopTextureID(this);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddImage(ImTextureID user_texture_id, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimRectUV(a, b, uv_a, uv_b, col);

    if (push_texture_id)
        PopTextureID();
}